

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_type_lookupFallbackSelector
          (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t selector)

{
  char cVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t found;
  sysbvm_tuple_t local_20;
  
  if (((type & 0xf) == 0 && type != 0) && (cVar1 = (char)*(undefined4 *)(type + 8), -1 < cVar1)) {
    if (*(sysbvm_tuple_t *)(type + 0x98) != 0) {
      local_20 = 0;
      _Var2 = sysbvm_methodDictionary_find(*(sysbvm_tuple_t *)(type + 0x98),selector,&local_20);
      if (_Var2) {
        return local_20;
      }
      cVar1 = (char)*(undefined4 *)(type + 8);
    }
    if (cVar1 < '\0') {
      sVar3 = 0;
    }
    else {
      sVar3 = *(sysbvm_tuple_t *)(type + 0x30);
    }
    sVar3 = sysbvm_type_lookupFallbackSelector(context,sVar3,selector);
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_lookupFallbackSelector(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t selector)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return SYSBVM_NULL_TUPLE;
    if(sysbvm_tuple_isDummyValue(type)) return SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t methodDictionary = sysbvm_type_getFallbackMethodDictionary(type);
    if(methodDictionary)
    {
        sysbvm_tuple_t found = SYSBVM_NULL_TUPLE;
        if(sysbvm_methodDictionary_find(methodDictionary, selector, &found))
            return found;
    }

    return sysbvm_type_lookupFallbackSelector(context, sysbvm_type_getSupertype(type), selector);
}